

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O1

int saslclientio_open_async
              (CONCRETE_IO_HANDLE sasl_client_io,ON_IO_OPEN_COMPLETE on_io_open_complete,
              void *on_io_open_complete_context,ON_BYTES_RECEIVED on_bytes_received,
              void *on_bytes_received_context,ON_IO_ERROR on_io_error,void *on_io_error_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance;
  
  if ((on_bytes_received == (ON_BYTES_RECEIVED)0x0 ||
      (on_io_open_complete == (ON_IO_OPEN_COMPLETE)0x0 || sasl_client_io == (CONCRETE_IO_HANDLE)0x0)
      ) || on_io_error == (ON_IO_ERROR)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x42a;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
              ,"saslclientio_open_async",0x429,1,
              "Bad arguments: sasl_client_io = %p, on_io_open_complete = %p, on_bytes_received = %p, on_io_error = %p"
              ,sasl_client_io,on_io_open_complete,on_bytes_received,on_io_error);
    return 0x42a;
  }
  if (*(int *)((long)sasl_client_io + 0x68) == 0) {
    *(ON_BYTES_RECEIVED *)((long)sasl_client_io + 8) = on_bytes_received;
    *(ON_IO_OPEN_COMPLETE *)((long)sasl_client_io + 0x10) = on_io_open_complete;
    *(ON_IO_ERROR *)((long)sasl_client_io + 0x20) = on_io_error;
    *(void **)((long)sasl_client_io + 0x28) = on_bytes_received_context;
    *(void **)((long)sasl_client_io + 0x30) = on_io_open_complete_context;
    *(void **)((long)sasl_client_io + 0x40) = on_io_error_context;
    *(undefined8 *)((long)sasl_client_io + 0x48) = 0x100000001;
    *(undefined8 *)((long)sasl_client_io + 0x50) = 0;
    *(undefined4 *)((long)sasl_client_io + 0x68) = 1;
    *(byte *)((long)sasl_client_io + 0x78) = *(byte *)((long)sasl_client_io + 0x78) & 0xfc;
    iVar1 = xio_open(*sasl_client_io,on_underlying_io_open_complete,sasl_client_io,
                     on_underlying_io_bytes_received,sasl_client_io,on_underlying_io_error,
                     sasl_client_io);
    if (iVar1 == 0) {
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x44a;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x44a;
    }
    pcVar4 = "xio_open failed";
    iVar3 = 0x449;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x433;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x433;
    }
    pcVar4 = "Open called while already OPEN";
    iVar3 = 0x432;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/saslclientio.c"
            ,"saslclientio_open_async",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int saslclientio_open_async(CONCRETE_IO_HANDLE sasl_client_io, ON_IO_OPEN_COMPLETE on_io_open_complete, void* on_io_open_complete_context, ON_BYTES_RECEIVED on_bytes_received, void* on_bytes_received_context, ON_IO_ERROR on_io_error, void* on_io_error_context)
{
    int result = 0;

    if ((sasl_client_io == NULL) ||
        (on_io_open_complete == NULL) ||
        (on_bytes_received == NULL) ||
        (on_io_error == NULL))
    {
        /* Codes_SRS_SASLCLIENTIO_01_011: [If any of the `sasl_client_io`, `on_io_open_complete`, `on_bytes_received` or `on_io_error` arguments is NULL, `saslclientio_open` shall fail and return a non-zero value.] */
        LogError("Bad arguments: sasl_client_io = %p, on_io_open_complete = %p, on_bytes_received = %p, on_io_error = %p",
            sasl_client_io, on_io_open_complete, on_bytes_received, on_io_error);
        result = MU_FAILURE;
    }
    else
    {
        SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance = (SASL_CLIENT_IO_INSTANCE*)sasl_client_io;

        if (sasl_client_io_instance->io_state != IO_STATE_NOT_OPEN)
        {
            LogError("Open called while already OPEN");
            result = MU_FAILURE;
        }
        else
        {
            sasl_client_io_instance->on_bytes_received = on_bytes_received;
            sasl_client_io_instance->on_io_open_complete = on_io_open_complete;
            sasl_client_io_instance->on_io_error = on_io_error;
            sasl_client_io_instance->on_bytes_received_context = on_bytes_received_context;
            sasl_client_io_instance->on_io_open_complete_context = on_io_open_complete_context;
            sasl_client_io_instance->on_io_error_context = on_io_error_context;
            sasl_client_io_instance->sasl_header_exchange_state = SASL_HEADER_EXCHANGE_IDLE;
            sasl_client_io_instance->sasl_client_negotiation_state = SASL_CLIENT_NEGOTIATION_NOT_STARTED;
            sasl_client_io_instance->header_bytes_received = 0;
            sasl_client_io_instance->io_state = IO_STATE_OPENING_UNDERLYING_IO;
            sasl_client_io_instance->is_trace_on = 0;
            sasl_client_io_instance->is_trace_on_set = 0;

            /* Codes_SRS_SASLCLIENTIO_01_009: [`saslclientio_open` shall call `xio_open` on the `underlying_io` passed to `saslclientio_create`.] */
            /* Codes_SRS_SASLCLIENTIO_01_013: [`saslclientio_open_async` shall pass to `xio_open` the `on_underlying_io_open_complete` as `on_io_open_complete` argument, `on_underlying_io_bytes_received` as `on_bytes_received` argument and `on_underlying_io_error` as `on_io_error` argument.] */
            if (xio_open(sasl_client_io_instance->underlying_io, on_underlying_io_open_complete, sasl_client_io_instance, on_underlying_io_bytes_received, sasl_client_io_instance, on_underlying_io_error, sasl_client_io_instance) != 0)
            {
                /* Codes_SRS_SASLCLIENTIO_01_012: [If the open of the `underlying_io` fails, `saslclientio_open_async` shall fail and return non-zero value.] */
                LogError("xio_open failed");
                result = MU_FAILURE;
            }
            else
            {
                /* Codes_SRS_SASLCLIENTIO_01_010: [On success, `saslclientio_open_async` shall return 0.]*/
                result = 0;
            }
        }
    }

    return result;
}